

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  ulong uVar1;
  imapstate iVar2;
  SessionHandle *data;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t __n;
  char *pcVar8;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  pcVar8 = (conn->proto).imapc.resptag;
  __n = strlen(pcVar8);
  uVar1 = __n + 1;
  if (((uVar1 <= len) && (iVar5 = bcmp(pcVar8,line,__n), iVar5 == 0)) && (line[__n] == ' ')) {
    if (len - uVar1 < 2) {
LAB_004caf3a:
      pcVar8 = "Bad tagged response";
      if ((len - uVar1 < 3) || (line[__n + 3] != 'D' || *(short *)(line + uVar1) != 0x4142))
      goto LAB_004cafb7;
      iVar5 = 0x42;
    }
    else if (*(short *)(line + uVar1) == 0x4b4f) {
      iVar5 = 0x4f;
    }
    else {
      if (*(short *)(line + uVar1) != 0x4f4e) goto LAB_004caf3a;
      iVar5 = 0x4e;
    }
    goto switchD_004cb008_caseD_15;
  }
  if ((len < 2) || (*(short *)line != 0x202a)) {
    if ((len != 3) || (*line != '+')) {
      if (len < 2) {
        return false;
      }
      if (*(short *)line != 0x202b) {
        return false;
      }
    }
    uVar6 = (conn->proto).imapc.state - IMAP_AUTHENTICATE_PLAIN;
    pcVar8 = "Unexpected continuation response";
    if ((0x13 < uVar6) || (iVar5 = 0x2b, (0x828ffU >> (uVar6 & 0x1f) & 1) == 0)) {
LAB_004cafb7:
      Curl_failf(data,pcVar8);
      iVar5 = -1;
    }
    goto switchD_004cb008_caseD_15;
  }
  iVar2 = (conn->proto).imapc.state;
  iVar5 = 0x2a;
  _Var4 = false;
  switch(iVar2) {
  case IMAP_LIST:
    if ((*(long *)((long)pvVar3 + 0x38) == 0) && (_Var4 = imap_matchresp(line,len,"LIST"), !_Var4))
    {
      return false;
    }
    if (((*(char **)((long)pvVar3 + 0x38) != (char *)0x0) &&
        (_Var4 = imap_matchresp(line,len,*(char **)((long)pvVar3 + 0x38)), !_Var4)) &&
       ((iVar7 = strcmp(*(char **)((long)pvVar3 + 0x38),"STORE"), iVar7 != 0 ||
        (_Var4 = imap_matchresp(line,len,"FETCH"), !_Var4)))) {
      pcVar8 = *(char **)((long)pvVar3 + 0x38);
      iVar7 = strcmp(pcVar8,"SELECT");
      if ((((((iVar7 != 0) && (iVar7 = strcmp(pcVar8,"EXAMINE"), iVar7 != 0)) &&
            (iVar7 = strcmp(pcVar8,"SEARCH"), iVar7 != 0)) &&
           ((iVar7 = strcmp(pcVar8,"EXPUNGE"), iVar7 != 0 &&
            (iVar7 = strcmp(pcVar8,"LSUB"), iVar7 != 0)))) &&
          (iVar7 = strcmp(pcVar8,"UID"), iVar7 != 0)) && (iVar7 = strcmp(pcVar8,"NOOP"), iVar7 != 0)
         ) {
        return false;
      }
    }
  case IMAP_SELECT:
    goto switchD_004cb008_caseD_15;
  case IMAP_FETCH:
    pcVar8 = "FETCH";
    break;
  case IMAP_FETCH_FINAL:
  case IMAP_APPEND:
  case IMAP_APPEND_FINAL:
    goto switchD_004cb008_caseD_17;
  case IMAP_SEARCH:
    pcVar8 = "SEARCH";
    break;
  default:
    if (iVar2 != IMAP_CAPABILITY) {
      return false;
    }
    pcVar8 = "CAPABILITY";
  }
  _Var4 = imap_matchresp(line,len,pcVar8);
  if (!_Var4) {
    return false;
  }
switchD_004cb008_caseD_15:
  *resp = iVar5;
  _Var4 = true;
switchD_004cb008_caseD_17:
  return _Var4;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = 'O';
    else if(len >= 2 && !memcmp(line, "NO", 2))
      *resp = 'N';
    else if(len >= 3 && !memcmp(line, "BAD", 3))
      *resp = 'B';
    else {
      failf(conn->data, "Bad tagged response");
      *resp = -1;
    }

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (strcmp(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           strcmp(imap->custom, "SELECT") &&
           strcmp(imap->custom, "EXAMINE") &&
           strcmp(imap->custom, "SEARCH") &&
           strcmp(imap->custom, "EXPUNGE") &&
           strcmp(imap->custom, "LSUB") &&
           strcmp(imap->custom, "UID") &&
           strcmp(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if((len == 3 && !memcmp("+", line, 1)) ||
     (len >= 2 && !memcmp("+ ", line, 2))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE_PLAIN:
      case IMAP_AUTHENTICATE_LOGIN:
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      case IMAP_AUTHENTICATE_CRAMMD5:
      case IMAP_AUTHENTICATE_DIGESTMD5:
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      case IMAP_AUTHENTICATE_NTLM:
      case IMAP_AUTHENTICATE_NTLM_TYPE2MSG:
      case IMAP_AUTHENTICATE_XOAUTH2:
      case IMAP_AUTHENTICATE_FINAL:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}